

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O2

void __thiscall pool_layer_t::calc_grads(pool_layer_t *this,tensor_t<float> *grad_next_layer)

{
  float fVar1;
  undefined8 uVar2;
  float *pfVar3;
  int _x;
  int x;
  int x_00;
  int y;
  int y_00;
  int z;
  int _z;
  int _y;
  range_t rn;
  float local_6c;
  range_t local_48;
  
  for (x_00 = 0; x_00 < (this->super_layer_t).in.size.x; x_00 = x_00 + 1) {
    for (y_00 = 0; y_00 < (this->super_layer_t).in.size.y; y_00 = y_00 + 1) {
      map_to_output(&local_48,this,x_00,y_00);
      for (_z = 0; _z < (this->super_layer_t).in.size.z; _z = _z + 1) {
        local_6c = 0.0;
        for (_x = local_48.min_x; _y = local_48.min_y, _x <= local_48.max_x; _x = _x + 1) {
          for (; _y <= local_48.max_y; _y = _y + 1) {
            pfVar3 = tensor_t<float>::get(&(this->super_layer_t).in,x_00,y_00,_z);
            fVar1 = *pfVar3;
            pfVar3 = tensor_t<float>::get(&(this->super_layer_t).out,_x,_y,_z);
            uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar3),0);
            pfVar3 = tensor_t<float>::get(grad_next_layer,_x,_y,_z);
            local_6c = (float)((uint)((byte)uVar2 & 1) * (int)*pfVar3) + local_6c;
          }
        }
        pfVar3 = tensor_t<float>::get(&(this->super_layer_t).grads_in,x_00,y_00,_z);
        *pfVar3 = local_6c;
      }
    }
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    for (int x = 0; x < in.size.x; x++) {
      for (int y = 0; y < in.size.y; y++) {
        range_t rn = map_to_output(x, y);
        for (int z = 0; z < in.size.z; z++) {
          float sum_error = 0;
          for (int i = rn.min_x; i <= rn.max_x; i++) {
            int minx = i * stride;
            for (int j = rn.min_y; j <= rn.max_y; j++) {
              int miny = j * stride;

              int is_max = in(x, y, z) == out(i, j, z) ? 1 : 0;
              sum_error += is_max * grad_next_layer(i, j, z);
            }
          }
          grads_in(x, y, z) = sum_error;
        }
      }
    }
  }